

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

uint32_t duckdb::UncompressedStringStorage::GetDictionaryEnd
                   (ColumnSegment *segment,BufferHandle *handle)

{
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&handle->node);
  return *(uint32_t *)(((handle->node).ptr)->buffer + segment->offset + 4);
}

Assistant:

uint32_t UncompressedStringStorage::GetDictionaryEnd(ColumnSegment &segment, BufferHandle &handle) {
	auto startptr = handle.Ptr() + segment.GetBlockOffset();
	return Load<uint32_t>(startptr + sizeof(uint32_t));
}